

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jsoncpp.cpp
# Opt level: O3

Int __thiscall Json::Value::asInt(Value *this)

{
  double dVar1;
  bool bVar2;
  uint uVar3;
  ostringstream oss;
  string local_1a0;
  ostringstream local_180 [376];
  
  uVar3 = (uint)(byte)this->field_0x8;
  switch(this->field_0x8) {
  case 0:
    break;
  case 1:
    bVar2 = isInt(this);
    if (!bVar2) {
      std::__cxx11::ostringstream::ostringstream(local_180);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_180,"LargestInt out of Int range",0x1b);
      std::__cxx11::stringbuf::str();
      throwLogicError(&local_1a0);
    }
    goto LAB_00109f68;
  case 2:
    bVar2 = isInt(this);
    if (!bVar2) {
      std::__cxx11::ostringstream::ostringstream(local_180);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_180,"LargestUInt out of Int range",0x1c);
      std::__cxx11::stringbuf::str();
      throwLogicError(&local_1a0);
    }
LAB_00109f68:
    uVar3 = *(uint *)&this->value_;
    break;
  case 3:
    dVar1 = (this->value_).real_;
    if ((dVar1 < -2147483648.0) || (2147483647.0 < dVar1)) {
      std::__cxx11::ostringstream::ostringstream(local_180);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_180,"double out of Int range",0x17);
      std::__cxx11::stringbuf::str();
      throwLogicError(&local_1a0);
    }
    uVar3 = (uint)dVar1;
    break;
  default:
    std::__cxx11::ostringstream::ostringstream(local_180);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_180,"Value is not convertible to Int.",0x20);
    std::__cxx11::stringbuf::str();
    throwLogicError(&local_1a0);
  case 5:
    uVar3 = (uint)(this->value_).bool_;
  }
  return uVar3;
}

Assistant:

Value::Int Value::asInt() const {
  switch (type_) {
  case intValue:
    JSON_ASSERT_MESSAGE(isInt(), "LargestInt out of Int range");
    return Int(value_.int_);
  case uintValue:
    JSON_ASSERT_MESSAGE(isInt(), "LargestUInt out of Int range");
    return Int(value_.uint_);
  case realValue:
    JSON_ASSERT_MESSAGE(InRange(value_.real_, minInt, maxInt),
                        "double out of Int range");
    return Int(value_.real_);
  case nullValue:
    return 0;
  case booleanValue:
    return value_.bool_ ? 1 : 0;
  default:
    break;
  }
  JSON_FAIL_MESSAGE("Value is not convertible to Int.");
}